

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O0

void __thiscall QCommandLineOption::setDescription(QCommandLineOption *this,QString *description)

{
  QString *in_RSI;
  QString *this_00;
  
  this_00 = in_RSI;
  QSharedDataPointer<QCommandLineOptionPrivate>::operator->
            ((QSharedDataPointer<QCommandLineOptionPrivate> *)in_RSI);
  QString::operator=(this_00,in_RSI);
  return;
}

Assistant:

void QCommandLineOption::setDescription(const QString &description)
{
    d->description = description;
}